

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

void tls_thread(void *arg)

{
  void *pvVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  
  pvVar1 = uv_key_get(&tls_key);
  if (pvVar1 == (void *)0x0) {
    uv_key_set(&tls_key,arg);
    pvVar2 = uv_key_get(&tls_key);
    if (pvVar2 == arg) {
      uv_key_set(&tls_key,(void *)0x0);
      pvVar1 = uv_key_get(&tls_key);
      if (pvVar1 == (void *)0x0) {
        return;
      }
      pvVar2 = (void *)0x0;
      pcVar5 = "NULL";
      pcVar4 = "uv_key_get(&tls_key)";
      uVar3 = 0xc5;
    }
    else {
      pcVar5 = "uv_key_get(&tls_key)";
      pcVar4 = "arg";
      uVar3 = 0xc3;
      pvVar1 = arg;
    }
  }
  else {
    pvVar2 = (void *)0x0;
    pcVar5 = "NULL";
    pcVar4 = "uv_key_get(&tls_key)";
    uVar3 = 0xc1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
          ,uVar3,pcVar4,"==",pcVar5,pvVar1,"==",pvVar2);
  abort();
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT_NULL(uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT_PTR_EQ(arg, uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT_NULL(uv_key_get(&tls_key));
}